

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O0

pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> * __thiscall
Disa::Matrix_Sparse::insert
          (pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool>
           *__return_storage_ptr__,Matrix_Sparse *this,size_t *i_row,size_t *i_column,double *value)

{
  ulong uVar1;
  double dVar2;
  bool bVar3;
  size_t sVar4;
  double dVar5;
  double *pdVar6;
  size_t *psVar7;
  reference __first;
  Scalar *__last;
  reference puVar8;
  reference value_00;
  bool bVar9;
  bool local_139;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_138;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_130;
  const_iterator local_128;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_120;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_118;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_110;
  const_iterator local_108;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_100;
  Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> local_f8;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_d8;
  difference_type local_d0;
  difference_type distance;
  __unspec local_b9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_b8;
  type_conflict1 local_a9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  non_zeros;
  undefined1 local_90 [48];
  undefined1 local_60 [8];
  iterator_element iter_insert;
  size_t local_38;
  size_t local_30;
  double *local_28;
  double *value_local;
  size_t *i_column_local;
  size_t *i_row_local;
  Matrix_Sparse *this_local;
  
  uVar1 = *i_row;
  local_28 = value;
  value_local = (double *)i_column;
  i_column_local = i_row;
  i_row_local = (size_t *)this;
  sVar4 = size_row(this);
  if (sVar4 <= uVar1) {
    local_30 = *i_column_local + 1;
    resize(this,&local_30,&this->column_size);
  }
  dVar2 = *value_local;
  dVar5 = (double)size_column(this);
  if ((ulong)dVar5 <= (ulong)dVar2) {
    local_38 = size_row(this);
    iter_insert.matrix = (matrix_type *)((long)*value_local + 1);
    resize(this,&local_38,(size_t *)&iter_insert.matrix);
  }
  lower_bound((iterator_element *)local_60,this,i_column_local,(size_t *)value_local);
  operator[]((Matrix_Sparse *)local_90,(size_t *)this);
  Matrix_Sparse_Row<Disa::Matrix_Sparse>::end
            ((iterator *)(local_90 + 0x10),(Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_90);
  bVar3 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator==
                    ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_60,
                     (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)(local_90 + 0x10));
  bVar9 = true;
  if (!bVar3) {
    pdVar6 = (double *)
             Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column
                       ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_60);
    bVar9 = *pdVar6 != *value_local;
  }
  if (bVar9) {
    local_a8._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->row_non_zero);
    psVar7 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_row
                       ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_60);
    local_a0 = std::
               next<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                         (local_a8,*psVar7 + 1);
    while( true ) {
      local_b8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->row_non_zero);
      local_a9 = (type_conflict1)
                 __gnu_cxx::
                 operator<=><unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                           (&local_a0,&local_b8);
      std::__cmp_cat::__unspec::__unspec(&local_b9,(__unspec *)0x0);
      bVar9 = std::operator<(local_a9);
      if (!bVar9) break;
      distance = (difference_type)
                 __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator++(&local_a0,0);
      puVar8 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&distance);
      *puVar8 = *puVar8 + 1;
    }
    local_d8._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::cbegin(&this->element_value);
    __first = __gnu_cxx::
              __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
              operator*(&local_d8);
    __last = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator*
                       ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_60);
    local_d0 = std::distance<double_const*>(__first,__last);
    psVar7 = i_column_local;
    local_118._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->column_index);
    local_110 = __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator+(&local_118,local_d0);
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                *)&local_108,&local_110);
    local_100._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
                   (&this->column_index,local_108,(value_type_conflict *)value_local);
    puVar8 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_100);
    local_138._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(&this->element_value);
    local_130 = __gnu_cxx::
                __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                operator+(&local_138,local_d0);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
               &local_128,&local_130);
    local_120._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::insert
                   (&this->element_value,local_128,local_28);
    value_00 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_120);
    Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
              (&local_f8,this,psVar7,puVar8,value_00);
    local_139 = true;
    std::pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool>::pair<bool,_true>
              (__return_storage_ptr__,&local_f8,&local_139);
  }
  else {
    non_zeros._M_current._7_1_ = 0;
    std::pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool>::pair<bool,_true>
              (__return_storage_ptr__,
               (Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_60,
               (bool *)((long)&non_zeros._M_current + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<Matrix_Sparse::iterator_element, bool> Matrix_Sparse::insert(const std::size_t& i_row,
                                                                       const std::size_t& i_column,
                                                                       const double& value) {
  // Resize if we need to.
  if(i_row >= size_row()) resize(i_row + 1, column_size);
  if(i_column >= size_column()) resize(size_row(), i_column + 1);
  const auto iter_insert = lower_bound(i_row, i_column);
  if(!(iter_insert == (*this)[i_row].end() || iter_insert.i_column() != i_column)) return {iter_insert, false};

  for(auto non_zeros = std::next(row_non_zero.begin(), static_cast<s_size_t>(iter_insert.i_row() + 1));
      non_zeros < row_non_zero.end(); ++(*non_zeros++))
    ;
  const auto distance = std::distance(&*element_value.cbegin(), &*iter_insert);
  return {{this, i_row, &*column_index.insert(column_index.begin() + distance, i_column),
           &*element_value.insert(element_value.begin() + distance, value)},
          true};
}